

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O1

void ihevc_inter_pred_luma_vert_w16inp
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short *psVar1;
  long lVar2;
  int iVar3;
  short *psVar4;
  int iVar5;
  long lVar6;
  short *psVar7;
  ulong uVar8;
  
  if (0 < ht) {
    lVar2 = (long)src_strd;
    psVar1 = pi2_src + lVar2 * -3;
    iVar3 = 0;
    do {
      if (0 < wd) {
        uVar8 = 0;
        psVar4 = psVar1;
        do {
          lVar6 = 0;
          iVar5 = 0;
          psVar7 = psVar4;
          do {
            iVar5 = iVar5 + (int)*psVar7 * (int)pi1_coeff[lVar6];
            lVar6 = lVar6 + 1;
            psVar7 = psVar7 + lVar2;
          } while (lVar6 != 8);
          iVar5 = (iVar5 >> 6) + 0x20 >> 6;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_dst[uVar8] = (UWORD8)iVar5;
          uVar8 = uVar8 + 1;
          psVar4 = psVar4 + 1;
        } while (uVar8 != (uint)wd);
      }
      pu1_dst = pu1_dst + dst_strd;
      iVar3 = iVar3 + 1;
      psVar1 = psVar1 + lVar2;
    } while (iVar3 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp(WORD16 *pi2_src,
                                       UWORD8 *pu1_dst,
                                       WORD32 src_strd,
                                       WORD32 dst_strd,
                                       WORD8 *pi1_coeff,
                                       WORD32 ht,
                                       WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 3) * src_strd];

            i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i4_tmp = CLIP_U8(i4_tmp);

            pu1_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pu1_dst += dst_strd;
    }

}